

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O3

int cmp_D2A(Bigint *a,Bigint *b)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = a->wds - b->wds;
  if (iVar3 != 0) {
    return iVar3;
  }
  lVar4 = (long)b->wds * 4 + 0x1c;
  do {
    uVar1 = *(uint *)((long)a->x + lVar4 + -0x20);
    uVar2 = *(uint *)((long)b->x + lVar4 + -0x20);
    if (uVar1 != uVar2) {
      return -(uint)(uVar1 < uVar2) | 1;
    }
    lVar4 = lVar4 + -4;
  } while (0x1c < lVar4);
  return 0;
}

Assistant:

int
cmp
#ifdef KR_headers
	(a, b) Bigint *a, *b;
#else
	(Bigint *a, Bigint *b)
#endif
{
	ULong *xa, *xa0, *xb, *xb0;
	int i, j;

	i = a->wds;
	j = b->wds;
#ifdef DEBUG
	if (i > 1 && !a->x[i-1])
		Bug("cmp called with a->x[a->wds-1] == 0");
	if (j > 1 && !b->x[j-1])
		Bug("cmp called with b->x[b->wds-1] == 0");
#endif
	if (i -= j)
		return i;
	xa0 = a->x;
	xa = xa0 + j;
	xb0 = b->x;
	xb = xb0 + j;
	for(;;) {
		if (*--xa != *--xb)
			return *xa < *xb ? -1 : 1;
		if (xa <= xa0)
			break;
		}
	return 0;
	}